

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::InitBlockScopedContent
          (ByteCodeGenerator *this,ParseNodeBlock *pnodeBlock,DebuggerScope *debuggerScope,
          FuncInfo *funcInfo)

{
  ByteCodeWriter *this_00;
  OpCode OVar1;
  Symbol *this_01;
  Scope *scope;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  PropertyId PVar5;
  uint uVar6;
  undefined4 *puVar7;
  FuncInfo *this_02;
  ParseNodeVar *pPVar8;
  OpCode op;
  ParseNodePtr this_03;
  
  if ((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x27b,"(pnodeBlock->nop == knopBlock)","pnodeBlock->nop == knopBlock");
    if (!bVar3) {
LAB_007fa715:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
    if ((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeGenerator.h"
                         ,0x1ef,"(pnodeBlock->nop == knopBlock)","pnodeBlock->nop == knopBlock");
      if (!bVar3) goto LAB_007fa715;
      *puVar7 = 0;
    }
  }
  this_03 = pnodeBlock->pnodeLexVars;
  if (this_03 != (ParseNodePtr)0x0) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    this_00 = &this->m_writer;
    do {
      if (debuggerScope == (DebuggerScope *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x281,"(debuggerScope)",
                           "Missing a case of scope tracking in BeginEmitBlock.");
        if (!bVar3) goto LAB_007fa715;
        *puVar7 = 0;
      }
      this_02 = TopFuncInfo(this);
      pPVar8 = ParseNode::AsParseNodeVar(this_03);
      this_01 = pPVar8->sym;
      if ((this_01->field_0x42 & 8) == 0) {
        scope = this_01->scope;
        bVar3 = Symbol::IsInSlot(this_01,this,this_02,false);
        if ((bVar3) ||
           (((scope->field_0x44 & 2) != 0 &&
            (bVar3 = Symbol::NeedsSlotAlloc(this_01,this,this_02), bVar3)))) {
          if ((scope->field_0x44 & 2) == 0) {
            RVar4 = FuncInfo::AcquireTmpRegister(this_02);
            Js::ByteCodeWriter::Reg1(this_00,InitUndecl,RVar4);
            EmitLocalPropInit(this,RVar4,this_01,this_02);
            FuncInfo::ReleaseTmpRegister(this_02,RVar4);
            PVar5 = Symbol::EnsurePosition(this_01,this);
            TrackSlotArrayPropertyForDebugger
                      (this,debuggerScope,this_01,PVar5,(uint)(this_03->nop == knopConstDecl),false)
            ;
          }
          else {
            RVar4 = scope->location;
            PVar5 = Symbol::EnsurePosition(this_01,this);
            if ((RVar4 == 0xffffffff) || (RVar4 != this_02->frameObjRegister)) {
              RVar4 = FuncInfo::InnerScopeToRegSlot(this_02,scope);
              uVar6 = FuncInfo::FindOrAddInlineCacheId(this_02,RVar4,PVar5,false,true);
              op = InitUndeclLetFld;
              if (this_01->decl->nop == knopConstDecl) {
                op = InitUndeclConstFld;
              }
              Js::ByteCodeWriter::ElementPIndexed
                        (this_00,op,0xfffffffe,scope->innerScopeIndex,uVar6);
            }
            else {
              uVar6 = FuncInfo::FindOrAddInlineCacheId(this_02,RVar4,PVar5,false,true);
              Js::ByteCodeWriter::ElementP
                        (this_00,(ushort)(this_01->decl->nop == knopConstDecl) * 2 +
                                 InitUndeclLocalLetFld,0xfffffffe,uVar6,false,true);
            }
            TrackActivationObjectPropertyForDebugger
                      (this,debuggerScope,this_01,(uint)(this_03->nop == knopConstDecl),false);
          }
        }
        else if ((this_01->field_0x43 & 0x40) == 0) {
          pPVar8 = ParseNode::AsParseNodeVar(this_01->decl);
          if (pPVar8->isSwitchStmtDecl != '\0') {
            Js::ByteCodeWriter::Reg1(this_00,InitUndecl,this_01->location);
          }
          bVar3 = Symbol::NeedsSlotAlloc(this_01,this,this_02);
          if (bVar3) {
            PVar5 = Symbol::EnsurePosition(this_01,this);
            TrackSlotArrayPropertyForDebugger
                      (this,debuggerScope,this_01,PVar5,(uint)(this_03->nop == knopConstDecl),false)
            ;
          }
          else {
            TrackRegisterPropertyForDebugger
                      (this,debuggerScope,this_01,this_02,(uint)(this_03->nop == knopConstDecl),
                       false);
          }
        }
      }
      else {
        PVar5 = Symbol::EnsurePosition(this_01,this);
        if ((this->flags >> 10 & 1) == 0) {
          OVar1 = this_01->decl->nop;
          uVar6 = FuncInfo::FindOrAddReferencedPropertyId(this_02,PVar5);
          Js::ByteCodeWriter::ElementRootU
                    (this_00,OVar1 == knopConstDecl | InitUndeclRootLetFld,uVar6);
        }
        else {
          if ((this->flags >> 0x16 & 1) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x28c,"(this->IsConsoleScopeEval())",
                               "Let/Consts cannot be in global scope outside of console eval");
            if (!bVar3) goto LAB_007fa715;
            *puVar7 = 0;
          }
          OVar1 = this_01->decl->nop;
          uVar6 = FuncInfo::FindOrAddReferencedPropertyId(this_02,PVar5);
          Js::ByteCodeWriter::ElementScopedU
                    (this_00,(OVar1 == knopConstDecl) + InitUndeclConsoleLetFld,uVar6);
        }
      }
      pPVar8 = ParseNode::AsParseNodeVar(this_03);
      this_03 = pPVar8->pnodeNext;
    } while (this_03 != (ParseNodePtr)0x0);
  }
  return;
}

Assistant:

void ByteCodeGenerator::InitBlockScopedContent(ParseNodeBlock *pnodeBlock, Js::DebuggerScope* debuggerScope, FuncInfo *funcInfo)
{
    Assert(pnodeBlock->nop == knopBlock);

    auto genBlockInit = [this, debuggerScope, funcInfo](ParseNode *pnode)
    {
        // Only check if the scope is valid when let/const vars are in the scope.  If there are no let/const vars,
        // the debugger scope will not be created.
        AssertMsg(debuggerScope, "Missing a case of scope tracking in BeginEmitBlock.");

        FuncInfo *funcInfo = this->TopFuncInfo();
        Symbol *sym = pnode->AsParseNodeVar()->sym;
        Scope *scope = sym->GetScope();

        if (sym->GetIsGlobal())
        {
            Js::PropertyId propertyId = sym->EnsurePosition(this);
            if (this->flags & fscrEval)
            {
                AssertMsg(this->IsConsoleScopeEval(), "Let/Consts cannot be in global scope outside of console eval");
                Js::OpCode op = (sym->GetDecl()->nop == knopConstDecl) ? Js::OpCode::InitUndeclConsoleConstFld : Js::OpCode::InitUndeclConsoleLetFld;
                this->m_writer.ElementScopedU(op, funcInfo->FindOrAddReferencedPropertyId(propertyId));
            }
            else
            {
                Js::OpCode op = (sym->GetDecl()->nop == knopConstDecl) ?
                    Js::OpCode::InitUndeclRootConstFld : Js::OpCode::InitUndeclRootLetFld;
                this->m_writer.ElementRootU(op, funcInfo->FindOrAddReferencedPropertyId(propertyId));
            }
        }
        else if (sym->IsInSlot(this, funcInfo) || (scope->GetIsObject() && sym->NeedsSlotAlloc(this, funcInfo)))
        {
            if (scope->GetIsObject())
            {
                Js::RegSlot scopeLocation = scope->GetLocation();
                Js::PropertyId propertyId = sym->EnsurePosition(this);

                if (scopeLocation != Js::Constants::NoRegister && scopeLocation == funcInfo->frameObjRegister)
                {
                    uint cacheId = funcInfo->FindOrAddInlineCacheId(scopeLocation, propertyId, false, true);

                    Js::OpCode op = (sym->GetDecl()->nop == knopConstDecl) ?
                        Js::OpCode::InitUndeclLocalConstFld : Js::OpCode::InitUndeclLocalLetFld;

                    this->m_writer.ElementP(op, ByteCodeGenerator::ReturnRegister, cacheId);
                }
                else
                {
                    uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->InnerScopeToRegSlot(scope), propertyId, false, true);

                    Js::OpCode op = (sym->GetDecl()->nop == knopConstDecl) ?
                        Js::OpCode::InitUndeclConstFld : Js::OpCode::InitUndeclLetFld;

                    this->m_writer.ElementPIndexed(op, ByteCodeGenerator::ReturnRegister, scope->GetInnerScopeIndex(), cacheId);
                }

                TrackActivationObjectPropertyForDebugger(debuggerScope, sym, pnode->nop == knopConstDecl ? Js::DebuggerScopePropertyFlags_Const : Js::DebuggerScopePropertyFlags_None);
            }
            else
            {
                Js::RegSlot tmpReg = funcInfo->AcquireTmpRegister();
                this->m_writer.Reg1(Js::OpCode::InitUndecl, tmpReg);
                this->EmitLocalPropInit(tmpReg, sym, funcInfo);
                funcInfo->ReleaseTmpRegister(tmpReg);

                // Slot array properties are tracked in non-debug mode as well because they need to stay
                // around for heap enumeration and escaping during attach/detach.
                TrackSlotArrayPropertyForDebugger(debuggerScope, sym, sym->EnsurePosition(this), pnode->nop == knopConstDecl ? Js::DebuggerScopePropertyFlags_Const : Js::DebuggerScopePropertyFlags_None);
            }
        }
        else if (!sym->GetIsModuleExportStorage())
        {
            if (sym->GetDecl()->AsParseNodeVar()->isSwitchStmtDecl)
            {
                // let/const declared in a switch is the only case of a variable that must be checked for
                // use-before-declaration dynamically within its own function.
                this->m_writer.Reg1(Js::OpCode::InitUndecl, sym->GetLocation());
            }
            // Syms that begin in register may be delay-captured. In debugger mode, such syms
            // will live only in slots, so tell the debugger to find them there.
            if (sym->NeedsSlotAlloc(this, funcInfo))
            {
                TrackSlotArrayPropertyForDebugger(debuggerScope, sym, sym->EnsurePosition(this), pnode->nop == knopConstDecl ? Js::DebuggerScopePropertyFlags_Const : Js::DebuggerScopePropertyFlags_None);
            }
            else
            {
                TrackRegisterPropertyForDebugger(debuggerScope, sym, funcInfo, pnode->nop == knopConstDecl ? Js::DebuggerScopePropertyFlags_Const : Js::DebuggerScopePropertyFlags_None);
            }
        }
    };

    IterateBlockScopedVariables(pnodeBlock, genBlockInit);
}